

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsCreateRawTransactionRequest::ElementsCreateRawTransactionRequest
          (ElementsCreateRawTransactionRequest *this)

{
  ElementsCreateRawTransactionRequest *this_local;
  
  core::JsonClassBase<cfd::js::api::json::ElementsCreateRawTransactionRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsCreateRawTransactionRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsCreateRawTransactionRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ElementsCreateRawTransactionRequest_01b4b428;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  this->version_ = 2;
  this->locktime_ = 0;
  core::JsonObjectVector<cfd::js::api::json::TxInRequest,_cfd::js::api::TxInRequestStruct>::
  JsonObjectVector(&this->txins_);
  core::JsonObjectVector<cfd::js::api::json::ElementsTxOut,_cfd::js::api::ElementsTxOutStruct>::
  JsonObjectVector(&this->txouts_);
  ElementsTxOutFee::ElementsTxOutFee(&this->fee_);
  CollectFieldName();
  return;
}

Assistant:

ElementsCreateRawTransactionRequest() {
    CollectFieldName();
  }